

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

int anon_unknown.dwarf_67d875::ParseIndex
              (string *str,optional<(anonymous_namespace)::Args> *progress,ArrayIndex max)

{
  optional<(anonymous_namespace)::Args> *poVar1;
  bool bVar2;
  json_error *pjVar3;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  string local_f8;
  undefined1 local_d8 [8];
  cmAlphaNum sizeStr;
  ArrayIndex index;
  string_view local_78 [2];
  string_view local_58;
  string local_48;
  uint local_28 [2];
  unsigned_long lindex;
  optional<(anonymous_namespace)::Args> *poStack_18;
  ArrayIndex max_local;
  optional<(anonymous_namespace)::Args> *progress_local;
  string *str_local;
  
  lindex._4_4_ = max;
  poStack_18 = progress;
  progress_local = (optional<(anonymous_namespace)::Args> *)str;
  bVar2 = cmStrToULong(str,(unsigned_long *)local_28);
  if (!bVar2) {
    sizeStr.Digits_[0x1f] = '\x01';
    pjVar3 = (json_error *)__cxa_allocate_exception(0x28);
    local_58 = (string_view)::cm::operator____s("expected an array index, got: \'",0x1f);
    poVar1 = progress_local;
    local_78[0] = (string_view)::cm::operator____s("\'",1);
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              (&local_48,(static_string_view *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1,
               (static_string_view *)local_78);
    json_error::json_error
              (pjVar3,&local_48,
               (optional<(anonymous_namespace)::Args>)
               (poStack_18->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
               _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>);
    sizeStr.Digits_[0x1f] = '\0';
    __cxa_throw(pjVar3,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  if (lindex._4_4_ <= local_28[0]) {
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_d8,lindex._4_4_);
    pjVar3 = (json_error *)__cxa_allocate_exception(0x28);
    local_108 = (string_view)::cm::operator____s("expected an index less than ",0x1c);
    local_118 = cmAlphaNum::View((cmAlphaNum *)local_d8);
    local_128 = (string_view)::cm::operator____s(" got \'",6);
    poVar1 = progress_local;
    local_138 = (string_view)::cm::operator____s("\'",1);
    cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              (&local_f8,(static_string_view *)&local_108,&local_118,
               (static_string_view *)&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1,
               (static_string_view *)&local_138);
    json_error::json_error
              (pjVar3,&local_f8,
               (optional<(anonymous_namespace)::Args>)
               (poStack_18->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
               _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>);
    __cxa_throw(pjVar3,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  return local_28[0];
}

Assistant:

int ParseIndex(
  const std::string& str, cm::optional<Args> const& progress = cm::nullopt,
  Json::ArrayIndex max = std::numeric_limits<Json::ArrayIndex>::max())
{
  unsigned long lindex;
  if (!cmStrToULong(str, &lindex)) {
    throw json_error(cmStrCat("expected an array index, got: '"_s, str, "'"_s),
                     progress);
  }
  Json::ArrayIndex index = static_cast<Json::ArrayIndex>(lindex);
  if (index >= max) {
    cmAlphaNum sizeStr{ max };
    throw json_error(cmStrCat("expected an index less than "_s, sizeStr.View(),
                              " got '"_s, str, "'"_s),
                     progress);
  }
  return index;
}